

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O1

PropertyDefinition * __thiscall
Rml::PropertyDefinition::AddParser
          (PropertyDefinition *this,String *parser_name,String *parser_parameters)

{
  Property *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pPVar2;
  pointer pPVar3;
  bool bVar4;
  pointer pbVar5;
  int iVar6;
  long lVar7;
  type piVar8;
  pointer pbVar9;
  bool bVar10;
  int parameter_value;
  String unparsed_value;
  StringList parameter_list;
  ParserState new_parser;
  int local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  PropertyDefinition *local_90;
  StringList local_88;
  undefined1 local_68 [8];
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60.mKeyVals = (Node *)(local_68 + 0x20);
  local_60.mNumElements = 0;
  local_60.mMask = 0;
  local_60.mMaxNumElementsAllowed = 0;
  local_60.mInfoInc = 0x20;
  local_60.mInfoHashShift = 0;
  local_60.mInfo = (uint8_t *)local_60.mKeyVals;
  local_68 = (undefined1  [8])StyleSheetSpecification::GetParser(parser_name);
  if (local_68 == (undefined1  [8])0x0) {
    Log::Message(LT_ERROR,"Property was registered with invalid parser \'%s\'.",
                 (parser_name->_M_dataplus)._M_p);
  }
  else {
    if (parser_parameters->_M_string_length != 0) {
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90 = this;
      StringUtilities::ExpandString(&local_88,parser_parameters,',');
      pbVar5 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_d4 = 0;
      bVar10 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar10) {
        pbVar9 = local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          lVar7 = ::std::__cxx11::string::find((char)pbVar9,0x3d);
          if (lVar7 == -1) {
LAB_0024dab0:
            iVar6 = local_d4;
            ::std::__cxx11::string::substr((ulong)&local_d0,(ulong)pbVar9);
            piVar8 = robin_hood::detail::
                     Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                     ::doCreateByKey<std::__cxx11::string,int>
                               ((Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                                 *)(local_68 + 8),&local_d0);
            *piVar8 = iVar6;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            local_d4 = local_d4 + 1;
            bVar4 = true;
          }
          else {
            ::std::__cxx11::string::substr((ulong)&local_d0,(ulong)pbVar9);
            iVar6 = __isoc99_sscanf(local_d0._M_dataplus._M_p,"%d",&local_d4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if (iVar6 == 1) goto LAB_0024dab0;
            bVar4 = false;
            Log::Message(LT_ERROR,"Parser was added with invalid parameter \'%s\'.",
                         (pbVar9->_M_dataplus)._M_p);
          }
          if (!bVar4) break;
          pbVar9 = pbVar9 + 1;
          bVar10 = pbVar9 == pbVar5;
        } while (!bVar10);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      this = local_90;
      if (!bVar10) goto LAB_0024dc4d;
    }
    pPVar2 = (this->parsers).
             super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pPVar3 = (this->parsers).
             super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ::std::
    vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
    ::push_back(&this->parsers,(value_type *)local_68);
    if ((this->default_value).unit == UNKNOWN) {
      this_00 = &this->default_value;
      paVar1 = &local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_allocated_capacity._0_4_ =
           local_b0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this_00->value,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar1) {
        local_d0.field_2._8_4_ = local_b0.field_2._8_4_;
        local_d0.field_2._12_4_ = local_b0.field_2._12_4_;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      }
      local_d0.field_2._M_allocated_capacity._4_4_ = local_b0.field_2._M_allocated_capacity._4_4_;
      local_d0.field_2._M_allocated_capacity._0_4_ = local_b0.field_2._M_allocated_capacity._0_4_;
      local_d0._M_string_length = local_b0._M_string_length;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_allocated_capacity._0_4_ =
           local_b0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      iVar6 = (*(*(_func_int ***)local_68)[2])(local_68,this_00,&local_d0,local_68 + 8);
      if ((char)iVar6 == '\0') {
        Variant::Clear(&this_00->value);
        Variant::Set(&this_00->value,&local_d0);
        (this->default_value).unit = UNKNOWN;
      }
      else {
        (this->default_value).parser_index =
             (int)((ulong)((long)pPVar2 - (long)pPVar3) >> 3) * -0x49249249;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_0024dc4d:
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_68 + 8));
  return this;
}

Assistant:

PropertyDefinition& PropertyDefinition::AddParser(const String& parser_name, const String& parser_parameters)
{
	ParserState new_parser;

	// Fetch the parser.
	new_parser.parser = StyleSheetSpecification::GetParser(parser_name);
	if (new_parser.parser == nullptr)
	{
		Log::Message(Log::LT_ERROR, "Property was registered with invalid parser '%s'.", parser_name.c_str());
		return *this;
	}

	// Split the parameter list, and set up the map.
	if (!parser_parameters.empty())
	{
		StringList parameter_list;
		StringUtilities::ExpandString(parameter_list, parser_parameters);

		int parameter_value = 0;
		for (const String& parameter : parameter_list)
		{
			// Look for an optional parameter value such as in "normal=400".
			const size_t i_equal = parameter.find('=');
			if (i_equal != String::npos)
			{
				if (!TypeConverter<String, int>::Convert(parameter.substr(i_equal + 1), parameter_value))
				{
					Log::Message(Log::LT_ERROR, "Parser was added with invalid parameter '%s'.", parameter.c_str());
					return *this;
				}
			}

			new_parser.parameters[parameter.substr(0, i_equal)] = parameter_value;
			parameter_value += 1;
		}
	}

	const int parser_index = (int)parsers.size();
	parsers.push_back(new_parser);

	// If the default value has not been parsed successfully yet, run it through the new parser.
	if (default_value.unit == Unit::UNKNOWN)
	{
		String unparsed_value = default_value.value.Get<String>();
		if (new_parser.parser->ParseValue(default_value, unparsed_value, new_parser.parameters))
		{
			default_value.parser_index = parser_index;
		}
		else
		{
			default_value.value = unparsed_value;
			default_value.unit = Unit::UNKNOWN;
		}
	}

	return *this;
}